

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Pooling_x86::forward(Pooling_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  size_t _elemsize;
  int *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  float *pfVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  int k;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  __m128 _inv_maxk;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  vector<int,_std::allocator<int>_> _space_ofs;
  int local_11c;
  int local_118;
  allocator_type local_111;
  ulong local_110;
  long local_108;
  ulong local_100;
  Mat local_f8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  void *local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  long local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if (((this->super_Pooling).adaptive_pooling != 0) || (bottom_blob->elempack != 4)) {
    iVar3 = Pooling::forward(&this->super_Pooling,bottom_blob,top_blob,opt);
    return iVar3;
  }
  uVar22 = bottom_blob->c;
  uVar11 = (ulong)uVar22;
  _elemsize = bottom_blob->elemsize;
  if ((this->super_Pooling).global_pooling == 0) {
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    local_100 = uVar11;
    Pooling::make_padding(&this->super_Pooling,bottom_blob,&local_f8,opt);
    iVar3 = -100;
    if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
      local_108 = CONCAT44(local_108._4_4_,local_f8.w);
      uVar11 = (long)(local_f8.w - (this->super_Pooling).kernel_w) /
               (long)(this->super_Pooling).stride_w;
      local_a0 = uVar11 & 0xffffffff;
      local_90 = CONCAT44(local_90._4_4_,local_f8.h);
      uVar5 = (long)(local_f8.h - (this->super_Pooling).kernel_h) /
              (long)(this->super_Pooling).stride_h;
      local_110 = uVar5 & 0xffffffff;
      uVar22 = (int)uVar11 + 1;
      iVar21 = (int)local_100;
      Mat::create(top_blob,uVar22,(int)uVar5 + 1,iVar21,_elemsize,4,opt->blob_allocator);
      iVar3 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar11 = (long)(this->super_Pooling).kernel_h * (long)(this->super_Pooling).kernel_w;
        std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar11,&local_111);
        iVar3 = (this->super_Pooling).kernel_h;
        if (0 < iVar3) {
          iVar4 = (this->super_Pooling).kernel_w;
          iVar9 = 0;
          iVar13 = 0;
          iVar16 = 0;
          do {
            if (0 < (this->super_Pooling).kernel_w) {
              lVar10 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar13 + lVar10] = iVar16 + (int)lVar10;
                lVar10 = lVar10 + 1;
                iVar3 = (int)lVar10;
              } while (iVar3 < (this->super_Pooling).kernel_w);
              iVar13 = iVar13 + iVar3;
              iVar16 = iVar16 + iVar3;
            }
            iVar16 = iVar16 + ((int)local_108 - iVar4);
            iVar9 = iVar9 + 1;
            iVar3 = (this->super_Pooling).kernel_h;
          } while (iVar9 < iVar3);
        }
        iVar4 = (this->super_Pooling).pooling_type;
        iVar9 = (int)uVar11;
        if (iVar4 == 0) {
          uVar1 = (this->super_Pooling).kernel_w;
          uVar6 = (this->super_Pooling).stride_w ^ 2;
          uVar14 = (this->super_Pooling).stride_h ^ 2;
          if (((iVar3 == 2 && uVar1 == 2) && uVar6 == 0) && uVar14 == 0) {
            pooling2x2s2_max_pack4_sse(&local_f8,top_blob,(Option *)(ulong)uVar1);
          }
          else if (((iVar3 == 3 && (uVar1 ^ 3) == 0) && uVar6 == 0) && uVar14 == 0) {
            pooling3x3s2_max_pack4_sse(&local_f8,top_blob,(Option *)(ulong)(uVar1 ^ 3));
          }
          else if (0 < iVar21) {
            uVar5 = 0;
            do {
              if (-1 < (int)local_110) {
                pvVar18 = (void *)(top_blob->cstep * uVar5 * top_blob->elemsize +
                                  (long)top_blob->data);
                iVar3 = 0;
                do {
                  if (-1 < (int)local_a0) {
                    uVar23 = 0;
                    do {
                      lVar10 = (long)(this->super_Pooling).stride_h * (long)iVar3 *
                               (long)local_f8.w *
                               CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                               local_f8.cstep * uVar5 *
                               CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                      lVar12 = (long)((this->super_Pooling).stride_w * (int)uVar23 * 4);
                      auVar26 = *(undefined1 (*) [16])((long)local_f8.data + lVar12 * 4 + lVar10);
                      if (0 < iVar9) {
                        uVar20 = 0;
                        do {
                          auVar26 = maxps(auVar26,*(undefined1 (*) [16])
                                                   ((long)local_f8.data +
                                                   (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar20] *
                                                  0x10 + lVar12 * 4 + lVar10));
                          uVar20 = uVar20 + 1;
                        } while ((uVar11 & 0xffffffff) != uVar20);
                      }
                      *(undefined1 (*) [16])((long)pvVar18 + uVar23 * 0x10) = auVar26;
                      uVar23 = uVar23 + 1;
                    } while (uVar23 != uVar22);
                  }
                  pvVar18 = (void *)((long)pvVar18 + (long)(int)(uVar22 * 4) * 4);
                  bVar24 = iVar3 != (int)local_110;
                  iVar3 = iVar3 + 1;
                } while (bVar24);
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 != local_100);
          }
        }
        else if (iVar4 == 1) {
          if ((this->super_Pooling).avgpool_count_include_pad == 0) {
            local_118 = 0;
            local_11c = 0;
            if ((this->super_Pooling).pad_mode == 0) {
              local_118 = (bottom_blob->w - local_f8.w) + (this->super_Pooling).pad_left +
                          (this->super_Pooling).pad_right;
              local_11c = (bottom_blob->h - local_f8.h) + (this->super_Pooling).pad_top +
                          (this->super_Pooling).pad_bottom;
            }
            if (0 < iVar21) {
              local_11c = local_11c + (int)local_90;
              local_118 = local_118 + (int)local_108;
              local_68 = (long)(int)(uVar22 * 4);
              local_58 = (ulong)uVar22;
              local_b0 = 0;
              do {
                if (-1 < (int)local_110) {
                  local_70 = local_f8.data;
                  local_78 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                  local_98 = (void *)(top_blob->cstep * local_b0 * top_blob->elemsize +
                                     (long)top_blob->data);
                  local_80 = (long)local_f8.w;
                  local_88 = local_f8.cstep * local_b0;
                  local_a8 = 0;
                  do {
                    if (-1 < (int)local_a0) {
                      lVar10 = (long)((this->super_Pooling).stride_h * (int)local_a8);
                      local_60 = (void *)((local_80 * lVar10 + local_88) * local_78 +
                                         (long)local_f8.data);
                      uVar11 = 0;
                      do {
                        lVar12 = (long)(this->super_Pooling).kernel_h;
                        if (lVar12 < 1) {
                          fVar30 = 0.0;
                          fVar25 = 0.0;
                          fVar27 = 0.0;
                          fVar28 = 0.0;
                          fVar29 = 0.0;
                        }
                        else {
                          uVar22 = (this->super_Pooling).kernel_w;
                          local_108 = (long)(local_11c - (this->super_Pooling).pad_bottom);
                          local_90 = (long)((this->super_Pooling).stride_w * (int)uVar11);
                          pvVar18 = (void *)(local_90 * 0x10 + (long)local_60);
                          fVar25 = 0.0;
                          fVar27 = 0.0;
                          fVar28 = 0.0;
                          fVar29 = 0.0;
                          lVar19 = 0;
                          iVar3 = 0;
                          do {
                            lVar15 = lVar19 + lVar10;
                            iVar21 = 0x2b;
                            if ((this->super_Pooling).pad_top <= lVar15) {
                              iVar21 = 0;
                              if (local_108 <= lVar15) {
                                iVar21 = 0x29;
                              }
                              if (lVar15 < local_108 && 0 < (int)uVar22) {
                                lVar17 = 0;
                                lVar15 = local_90;
                                do {
                                  iVar4 = 0x2e;
                                  if (((this->super_Pooling).pad_left <= lVar15) &&
                                     (iVar4 = 0x2c,
                                     lVar15 < local_118 - (this->super_Pooling).pad_right)) {
                                    pfVar7 = (float *)((long)pvVar18 + lVar17);
                                    fVar25 = fVar25 + *pfVar7;
                                    fVar27 = fVar27 + pfVar7[1];
                                    fVar28 = fVar28 + pfVar7[2];
                                    fVar29 = fVar29 + pfVar7[3];
                                    iVar3 = iVar3 + 1;
                                    iVar4 = 0;
                                  }
                                  iVar21 = 0;
                                  if ((iVar4 != 0x2e) && (iVar4 != 0)) break;
                                  lVar17 = lVar17 + 0x10;
                                  lVar15 = lVar15 + 1;
                                } while ((ulong)uVar22 << 4 != lVar17);
                              }
                            }
                            if ((iVar21 != 0x2b) && (iVar21 != 0)) break;
                            lVar19 = lVar19 + 1;
                            pvVar18 = (void *)((long)pvVar18 + local_78 * local_80);
                          } while (lVar19 != lVar12);
                          fVar30 = (float)iVar3;
                          local_50 = uVar11;
                        }
                        fVar30 = 1.0 / fVar30;
                        pfVar7 = (float *)((long)local_98 + uVar11 * 0x10);
                        *pfVar7 = fVar30 * fVar25;
                        pfVar7[1] = fVar30 * fVar27;
                        pfVar7[2] = fVar30 * fVar28;
                        pfVar7[3] = fVar30 * fVar29;
                        uVar11 = uVar11 + 1;
                      } while (uVar11 != local_58);
                    }
                    local_98 = (void *)((long)local_98 + local_68 * 4);
                    uVar22 = (int)local_a8 + 1;
                    bVar24 = (int)local_a8 != (int)local_110;
                    local_a8 = (ulong)uVar22;
                  } while (bVar24);
                }
                local_b0 = local_b0 + 1;
              } while (local_b0 != local_100);
            }
          }
          else if (0 < iVar21) {
            fVar25 = 1.0 / (float)iVar9;
            uVar5 = 0;
            do {
              if (-1 < (int)local_110) {
                pvVar18 = (void *)(top_blob->cstep * uVar5 * top_blob->elemsize +
                                  (long)top_blob->data);
                iVar3 = 0;
                do {
                  if (-1 < (int)local_a0) {
                    uVar23 = 0;
                    do {
                      if (iVar9 < 1) {
                        fVar27 = 0.0;
                        fVar28 = 0.0;
                        fVar29 = 0.0;
                        fVar30 = 0.0;
                      }
                      else {
                        fVar27 = 0.0;
                        fVar28 = 0.0;
                        fVar29 = 0.0;
                        fVar30 = 0.0;
                        uVar20 = 0;
                        do {
                          pfVar7 = (float *)((long)local_f8.data +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar20] *
                                            0x10 + (long)((this->super_Pooling).stride_w *
                                                          (int)uVar23 * 4) * 4 +
                                                   (long)(this->super_Pooling).stride_h *
                                                   (long)iVar3 *
                                                   (long)local_f8.w *
                                                   CONCAT44(local_f8.elemsize._4_4_,
                                                            (undefined4)local_f8.elemsize) +
                                                   local_f8.cstep * uVar5 *
                                                   CONCAT44(local_f8.elemsize._4_4_,
                                                            (undefined4)local_f8.elemsize));
                          fVar27 = fVar27 + *pfVar7;
                          fVar28 = fVar28 + pfVar7[1];
                          fVar29 = fVar29 + pfVar7[2];
                          fVar30 = fVar30 + pfVar7[3];
                          uVar20 = uVar20 + 1;
                        } while ((uVar11 & 0xffffffff) != uVar20);
                      }
                      pfVar7 = (float *)((long)pvVar18 + uVar23 * 0x10);
                      *pfVar7 = fVar27 * fVar25;
                      pfVar7[1] = fVar28 * fVar25;
                      pfVar7[2] = fVar29 * fVar25;
                      pfVar7[3] = fVar30 * fVar25;
                      uVar23 = uVar23 + 1;
                    } while (uVar23 != uVar22);
                  }
                  pvVar18 = (void *)((long)pvVar18 + (long)(int)(uVar22 * 4) * 4);
                  bVar24 = iVar3 != (int)local_110;
                  iVar3 = iVar3 + 1;
                } while (bVar24);
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 != local_100);
          }
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar3 = 0;
      }
    }
    piVar2 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_108 = CONCAT44(local_108._4_4_,bottom_blob->w);
    iVar21 = bottom_blob->h;
    Mat::create(top_blob,uVar22,_elemsize,4,opt->blob_allocator);
    iVar3 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar21 = iVar21 * (int)local_108;
      iVar3 = (this->super_Pooling).pooling_type;
      if (iVar3 == 0) {
        if ((int)uVar22 < 1) {
          return 0;
        }
        uVar5 = 0;
        do {
          lVar10 = bottom_blob->cstep * uVar5 * bottom_blob->elemsize;
          auVar26 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar10);
          if (0 < iVar21) {
            pauVar8 = (undefined1 (*) [16])((long)bottom_blob->data + lVar10);
            iVar3 = iVar21;
            do {
              auVar26 = maxps(auVar26,*pauVar8);
              pauVar8 = pauVar8 + 1;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar5 * 0x10) = auVar26;
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar11);
      }
      else {
        if (iVar3 != 1) {
          return 0;
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        fVar25 = 1.0 / (float)iVar21;
        uVar5 = 0;
        do {
          if (iVar21 < 1) {
            fVar27 = 0.0;
            fVar28 = 0.0;
            fVar29 = 0.0;
            fVar30 = 0.0;
          }
          else {
            pfVar7 = (float *)(bottom_blob->cstep * uVar5 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            fVar27 = 0.0;
            fVar28 = 0.0;
            fVar29 = 0.0;
            fVar30 = 0.0;
            iVar3 = iVar21;
            do {
              fVar27 = fVar27 + *pfVar7;
              fVar28 = fVar28 + pfVar7[1];
              fVar29 = fVar29 + pfVar7[2];
              fVar30 = fVar30 + pfVar7[3];
              pfVar7 = pfVar7 + 4;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          pfVar7 = (float *)((long)top_blob->data + uVar5 * 0x10);
          *pfVar7 = fVar27 * fVar25;
          pfVar7[1] = fVar28 * fVar25;
          pfVar7[2] = fVar29 * fVar25;
          pfVar7[3] = fVar30 * fVar25;
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar11);
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int Pooling_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

#if __AVX512F__
    if (elempack == 16)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _max = _mm512_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _max = _mm512_max_ps(_max, _val);
                        ptr += 16;
                    }

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _sum = _mm512_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _sum = _mm512_add_ps(_sum, _val);
                        ptr += 16;
                    }

                    __m512 _inv_size = _mm512_set1_ps(1.f / size);
                    __m512 _avg = _mm512_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                        __m512 _max = _mm512_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                            _max = _mm512_max_ps(_max, _val);
                        }

                        _mm512_storeu_ps(outptr, _max);
                        outptr += 16;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m512 _sum = _mm512_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m512 _val = _mm512_loadu_ps(m.row(sy) + sx * 16);
                                    _sum = _mm512_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m512 _inv_area = _mm512_set1_ps(1.f / area);
                            __m512 _avg = _mm512_mul_ps(_sum, _inv_area);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m512 _inv_maxk = _mm512_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            __m512 _sum = _mm512_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                _sum = _mm512_add_ps(_sum, _val);
                            }

                            __m512 _avg = _mm512_mul_ps(_sum, _inv_maxk);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX512F__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}